

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmeans.c
# Opt level: O2

float64 k_means_label_subset
                  (codew_t *label,vector_t *mean,uint32 n_mean,uint32 *subset,uint32 n_obs_subset,
                  uint32 veclen)

{
  float *pfVar1;
  float *pfVar2;
  vector_t pfVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  float64 fVar8;
  double dVar9;
  double dVar10;
  
  fVar8 = 0.0;
  uVar7 = 0;
  for (uVar5 = 0; uVar5 != n_obs_subset; uVar5 = uVar5 + 1) {
    pfVar3 = (*get_obs)(subset[uVar5]);
    dVar9 = 1e+300;
    for (uVar4 = 0; uVar4 != n_mean; uVar4 = uVar4 + 1) {
      uVar6 = 0;
      for (dVar10 = 0.0; (uVar6 < veclen && (dVar10 < dVar9));
          dVar10 = dVar10 + (double)(*pfVar1 - *pfVar2) * (double)(*pfVar1 - *pfVar2)) {
        pfVar1 = mean[uVar4] + uVar6;
        pfVar2 = pfVar3 + uVar6;
        uVar6 = uVar6 + 1;
      }
      if (dVar10 < dVar9) {
        uVar7 = uVar4 & 0xffffffff;
        dVar9 = dVar10;
      }
    }
    label[uVar5] = (codew_t)uVar7;
    fVar8 = (float64)((double)fVar8 + dVar9);
  }
  return fVar8;
}

Assistant:

float64
k_means_label_subset(codew_t *label,
		     vector_t *mean,
		     uint32 n_mean,       /* # of mean vectors */
		     uint32 *subset,
		     uint32 n_obs_subset,   /* in # of vectors */
		     uint32 veclen)
{
    uint32 i, j, b_j=0, l;
    float64 t, d;
    float64 b_d;
    float64 sqerr;
    vector_t c;
    vector_t m;

    for (i = 0, sqerr = 0; i < n_obs_subset; i++) {
	b_d = 1e300;

	c = get_obs(subset[i]);
	
	for (j = 0; j < n_mean; j++) {
	    m = mean[j];

	    for (l = 0, d = 0.0; (l < veclen) && (d < b_d); l++) {
		t = m[l] - c[l];
		d += t * t;
	    }

	    if (d < b_d) {
		b_d = d;
		b_j = j;
	    }
	}

	label[i] = b_j;

	sqerr += b_d;
    }

    return sqerr;
}